

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v256_intrinsics_v128.h
# Opt level: O2

v256 * v256_unpacklo_u8_s16(v256 a)

{
  v256 *in_RDI;
  v128 alVar1;
  undefined1 in_XMM2 [16];
  v128 alVar2;
  
  alVar2 = (v128)pmovzxbw(in_XMM2,(undefined1  [16])a.val[0]);
  alVar1[0] = (ulong)CONCAT16(a.val[0][1]._3_1_,
                              (uint6)CONCAT14(a.val[0][1]._2_1_,
                                              (uint)CONCAT12(a.val[0][1]._1_1_,
                                                             (ushort)(byte)a.val[0][1])));
  alVar1[1]._0_1_ = a.val[0][1]._4_1_;
  alVar1[1]._1_1_ = 0;
  alVar1[1]._2_1_ = a.val[0][1]._5_1_;
  alVar1[1]._3_1_ = 0;
  alVar1[1]._4_1_ = a.val[0][1]._6_1_;
  alVar1[1]._5_1_ = 0;
  alVar1[1]._6_1_ = a.val[0][1]._7_1_;
  alVar1[1]._7_1_ = 0;
  in_RDI->val[1] = alVar1;
  in_RDI->val[0] = alVar2;
  return in_RDI;
}

Assistant:

SIMD_INLINE v256 v256_unpacklo_u8_s16(v256 a) {
  return v256_from_v128(v128_unpackhi_u8_s16(a.val[0]),
                        v128_unpacklo_u8_s16(a.val[0]));
}